

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 CalcWindowAutoFitSize(ImGuiWindow *window,ImVec2 *size_contents)

{
  ImVec2 *pIVar1;
  int iVar2;
  ImGuiContext *pIVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  ImVec2 IVar9;
  float extraout_XMM0_Db;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar14;
  float fVar15;
  undefined1 auVar12 [16];
  float fVar16;
  undefined1 auVar13 [16];
  float fVar17;
  uint uVar18;
  float fVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float local_38;
  float fStack_34;
  
  pIVar3 = GImGui;
  fVar7 = ImGuiWindow::TitleBarHeight(window);
  fVar8 = ImGuiWindow::MenuBarHeight(window);
  fVar22 = (window->WindowPadding).x;
  fVar17 = (window->WindowPadding).y;
  fVar22 = fVar22 + fVar22;
  fVar17 = fVar17 + fVar17;
  local_38 = size_contents->x + fVar22;
  fStack_34 = fVar8 + fVar7 + size_contents->y + fVar17;
  fVar25 = extraout_XMM0_Db + 0.0;
  if (((uint)window->Flags >> 0x19 & 1) == 0) {
    auVar12._8_8_ = 0;
    auVar12._0_4_ = (pIVar3->Style).WindowMinSize.x;
    auVar12._4_4_ = (pIVar3->Style).WindowMinSize.y;
    if ((window->Flags & 0x14000000U) != 0) {
      auVar12 = minps(auVar12,_DAT_0019ca00);
    }
    uVar18 = (int)((uint)window->ViewportOwned << 0x1f) >> 0x1f;
    uVar20 = (int)((uint)window->ViewportOwned << 0x1f) >> 0x1f;
    fVar19 = (float)(uVar18 & 0x7f7fffff |
                    ~uVar18 & (uint)(window->Viewport->super_ImGuiViewport).Size.x);
    fVar21 = (float)(uVar20 & 0x7f7fffff |
                    ~uVar20 & (uint)(window->Viewport->super_ImGuiViewport).Size.y);
    iVar2 = window->ViewportAllowPlatformMonitorExtend;
    if ((-1 < (long)iVar2) && (iVar2 < (pIVar3->PlatformIO).Monitors.Size)) {
      pIVar1 = &(pIVar3->PlatformIO).Monitors.Data[iVar2].WorkSize;
      fVar19 = pIVar1->x;
      fVar21 = pIVar1->y;
    }
    IVar9 = (pIVar3->Style).DisplaySafeAreaPadding;
    fVar14 = IVar9.x;
    fVar11 = IVar9.y;
    fVar19 = fVar19 - (fVar14 + fVar14);
    fVar21 = fVar21 - (fVar11 + fVar11);
    fVar11 = auVar12._0_4_;
    fVar14 = auVar12._4_4_;
    fVar15 = auVar12._8_4_;
    fVar16 = auVar12._12_4_;
    uVar18 = -(uint)(fVar19 <= fVar11);
    uVar20 = -(uint)(fVar21 <= fVar14);
    fVar23 = (float)((uint)fVar15 & -(uint)(0.0 <= fVar15));
    fVar24 = (float)((uint)fVar16 & -(uint)(0.0 <= fVar16));
    fVar19 = (float)(~uVar18 & (uint)fVar19 | (uint)fVar11 & uVar18);
    fVar21 = (float)(~uVar20 & (uint)fVar21 | (uint)fVar14 & uVar20);
    uVar18 = -(uint)(fVar19 < local_38);
    uVar20 = -(uint)(fVar21 < fStack_34);
    uVar6 = -(uint)(fVar24 < fVar25);
    auVar13._0_4_ = (uint)fVar11 & -(uint)(local_38 < fVar11);
    auVar13._4_4_ = (uint)fVar14 & -(uint)(fStack_34 < fVar14);
    auVar13._8_4_ = (uint)fVar15 & -(uint)(0.0 < fVar15);
    auVar13._12_4_ = (uint)fVar16 & -(uint)(fVar25 < fVar16);
    auVar10._0_4_ =
         ~-(uint)(local_38 < fVar11) & (~uVar18 & (uint)(local_38 + 0.0) | (uint)fVar19 & uVar18);
    auVar10._4_4_ =
         ~-(uint)(fStack_34 < fVar14) & (~uVar20 & (uint)fStack_34 | (uint)fVar21 & uVar20);
    auVar10._8_4_ = ~-(uint)(0.0 < fVar15) & (uint)fVar23 & -(uint)(fVar23 < 0.0);
    auVar10._12_4_ = ~-(uint)(fVar25 < fVar16) & (~uVar6 & (uint)fVar25 | (uint)fVar24 & uVar6);
    auVar10 = auVar10 | auVar13;
    IVar9 = CalcWindowSizeAfterConstraint(window,auVar10._0_8_);
    uVar18 = window->Flags;
    bVar4 = 1;
    cVar5 = '\x01';
    if (size_contents->x <= IVar9.x - fVar22 || (uVar18 & 0x808) != 0x800) {
      cVar5 = (char)((uVar18 & 0xffff) >> 0xf);
    }
    if (size_contents->y <= (IVar9.y - fVar17) - (fVar8 + fVar7) || (uVar18 & 8) != 0) {
      bVar4 = (byte)(uVar18 >> 0xe) & 1;
    }
    local_38 = auVar10._0_4_;
    fStack_34 = auVar10._4_4_;
    if (cVar5 != '\0') {
      fStack_34 = fStack_34 + (pIVar3->Style).ScrollbarSize;
    }
    if (bVar4 != 0) {
      local_38 = local_38 + (pIVar3->Style).ScrollbarSize;
    }
  }
  else {
    local_38 = local_38 + 0.0;
  }
  IVar9.y = fStack_34;
  IVar9.x = local_38;
  return IVar9;
}

Assistant:

static ImVec2 CalcWindowAutoFitSize(ImGuiWindow* window, const ImVec2& size_contents)
{
    ImGuiContext& g = *GImGui;
    ImGuiStyle& style = g.Style;
    ImVec2 size_decorations = ImVec2(0.0f, window->TitleBarHeight() + window->MenuBarHeight());
    ImVec2 size_pad = window->WindowPadding * 2.0f;
    ImVec2 size_desired = size_contents + size_pad + size_decorations;
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Tooltip always resize
        return size_desired;
    }
    else
    {
        // Maximum window size is determined by the viewport size or monitor size
        const bool is_popup = (window->Flags & ImGuiWindowFlags_Popup) != 0;
        const bool is_menu = (window->Flags & ImGuiWindowFlags_ChildMenu) != 0;
        ImVec2 size_min = style.WindowMinSize;
        if (is_popup || is_menu) // Popups and menus bypass style.WindowMinSize by default, but we give then a non-zero minimum size to facilitate understanding problematic cases (e.g. empty popups)
            size_min = ImMin(size_min, ImVec2(4.0f, 4.0f));

        // FIXME-VIEWPORT-WORKAREA: May want to use GetWorkSize() instead of Size depending on the type of windows?
        ImVec2 avail_size = window->Viewport->Size;
        if (window->ViewportOwned)
            avail_size = ImVec2(FLT_MAX, FLT_MAX);
        const int monitor_idx = window->ViewportAllowPlatformMonitorExtend;
        if (monitor_idx >= 0 && monitor_idx < g.PlatformIO.Monitors.Size)
            avail_size = g.PlatformIO.Monitors[monitor_idx].WorkSize;
        ImVec2 size_auto_fit = ImClamp(size_desired, size_min, ImMax(size_min, avail_size - g.Style.DisplaySafeAreaPadding * 2.0f));

        // When the window cannot fit all contents (either because of constraints, either because screen is too small),
        // we are growing the size on the other axis to compensate for expected scrollbar. FIXME: Might turn bigger than ViewportSize-WindowPadding.
        ImVec2 size_auto_fit_after_constraint = CalcWindowSizeAfterConstraint(window, size_auto_fit);
        bool will_have_scrollbar_x = (size_auto_fit_after_constraint.x - size_pad.x - size_decorations.x < size_contents.x && !(window->Flags & ImGuiWindowFlags_NoScrollbar) && (window->Flags & ImGuiWindowFlags_HorizontalScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysHorizontalScrollbar);
        bool will_have_scrollbar_y = (size_auto_fit_after_constraint.y - size_pad.y - size_decorations.y < size_contents.y && !(window->Flags & ImGuiWindowFlags_NoScrollbar)) || (window->Flags & ImGuiWindowFlags_AlwaysVerticalScrollbar);
        if (will_have_scrollbar_x)
            size_auto_fit.y += style.ScrollbarSize;
        if (will_have_scrollbar_y)
            size_auto_fit.x += style.ScrollbarSize;
        return size_auto_fit;
    }
}